

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void yy_destructor(yyParser *yypParser,unsigned_short yymajor,YYMINORTYPE *yypminor)

{
  Parse *pPVar1;
  int iVar2;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,yymajor);
  if (iVar2 - 0xc3U < 0x68) {
    pPVar1 = yypParser->pParse;
    switch(iVar2) {
    case 0xc3:
    case 0xe3:
    case 0xe4:
    case 0xf0:
      sqlite3SelectDelete(pPVar1->db,yypminor->yy457);
      return;
    case 0xcd:
    case 0xce:
    case 0xea:
    case 0xec:
    case 0xf8:
    case 0x107:
    case 0x109:
    case 0x10c:
    case 0x113:
    case 0x118:
    case 0x126:
      sqlite3ExprDelete(pPVar1->db,yypminor->yy524);
      return;
    case 0xd2:
    case 0xdb:
    case 0xdc:
    case 0xe8:
    case 0xeb:
    case 0xed:
    case 0xf1:
    case 0xf2:
    case 0xfa:
    case 0xfe:
    case 0x106:
    case 0x108:
    case 0x125:
      sqlite3ExprListDelete(pPVar1->db,yypminor->yy434);
      return;
    case 0xe2:
    case 0xe9:
    case 0xf4:
    case 0xf5:
    case 0xfb:
      sqlite3SrcListDelete(pPVar1->db,yypminor->yy483);
      return;
    case 0xe5:
      sqlite3WithDelete(pPVar1->db,yypminor->yy59);
      return;
    case 0xef:
    case 0x121:
      sqlite3WindowListDelete(pPVar1->db,yypminor->yy295);
      return;
    case 0xf9:
    case 0xfc:
    case 0x100:
      sqlite3IdListDelete(pPVar1->db,yypminor->yy62);
      return;
    case 0x102:
    case 0x122:
    case 0x123:
    case 0x124:
      sqlite3WindowDelete(pPVar1->db,yypminor->yy295);
      return;
    case 0x10f:
    case 0x114:
      sqlite3DeleteTriggerStep(pPVar1->db,yypminor->yy455);
      return;
    case 0x111:
      sqlite3IdListDelete(pPVar1->db,(yypminor->yy90).b);
      return;
    case 0x128:
    case 0x129:
    case 0x12a:
      sqlite3ExprDelete(pPVar1->db,(yypminor->yy201).pExpr);
      return;
    }
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH
  sqlite3ParserCTX_FETCH
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 195: /* select */
    case 227: /* selectnowith */
    case 228: /* oneselect */
    case 240: /* values */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy457));
}
      break;
    case 205: /* term */
    case 206: /* expr */
    case 234: /* where_opt */
    case 236: /* having_opt */
    case 248: /* on_opt */
    case 263: /* case_operand */
    case 265: /* case_else */
    case 268: /* vinto */
    case 275: /* when_clause */
    case 280: /* key_opt */
    case 294: /* filter_opt */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy524));
}
      break;
    case 210: /* eidlist_opt */
    case 219: /* sortlist */
    case 220: /* eidlist */
    case 232: /* selcollist */
    case 235: /* groupby_opt */
    case 237: /* orderby_opt */
    case 241: /* nexprlist */
    case 242: /* sclp */
    case 250: /* exprlist */
    case 254: /* setlist */
    case 262: /* paren_exprlist */
    case 264: /* case_exprlist */
    case 293: /* part_opt */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy434));
}
      break;
    case 226: /* fullname */
    case 233: /* from */
    case 244: /* seltablist */
    case 245: /* stl_prefix */
    case 251: /* xfullname */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy483));
}
      break;
    case 229: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy59));
}
      break;
    case 239: /* window_clause */
    case 289: /* windowdefn_list */
{
sqlite3WindowListDelete(pParse->db, (yypminor->yy295));
}
      break;
    case 249: /* using_opt */
    case 252: /* idlist */
    case 256: /* idlist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy62));
}
      break;
    case 258: /* over_clause */
    case 290: /* windowdefn */
    case 291: /* window */
    case 292: /* frame_opt */
{
sqlite3WindowDelete(pParse->db, (yypminor->yy295));
}
      break;
    case 271: /* trigger_cmd_list */
    case 276: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy455));
}
      break;
    case 273: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy90).b);
}
      break;
    case 296: /* frame_bound */
    case 297: /* frame_bound_s */
    case 298: /* frame_bound_e */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy201).pExpr);
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}